

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

bool __thiscall pstore::uuid::is_null(uuid *this)

{
  bool bVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  uuid *this_local;
  
  pvVar2 = std::begin<std::array<unsigned_char,16ul>>(&this->data_);
  pvVar3 = std::end<std::array<unsigned_char,16ul>>(&this->data_);
  bVar1 = std::all_of<unsigned_char_const*,pstore::uuid::is_null()const::__0>(pvVar2,pvVar3);
  return bVar1;
}

Assistant:

bool uuid::is_null () const noexcept {
        return std::all_of (std::begin (data_), std::end (data_), [] (auto const v) { return !v; });
    }